

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearfit.cpp
# Opt level: O0

bool __thiscall
Logarithm::setSample(Logarithm *this,double *x,double *y,int count,bool enableWeight,double *w)

{
  undefined1 auVar1 [16];
  byte bVar2;
  ulong uVar3;
  double *x_00;
  int in_ECX;
  EVP_PKEY_CTX *in_RDX;
  EVP_PKEY_CTX *in_RSI;
  Polynomial *in_RDI;
  PolynomialFit *in_R9;
  double dVar4;
  bool ret;
  int i;
  double *px;
  double *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  
  Polynomial::copy(in_RDI,in_RSI,in_RDX);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ECX;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  x_00 = (double *)operator_new__(uVar3);
  iVar5 = 0;
  while( true ) {
    if (in_ECX <= iVar5) {
      bVar2 = PolynomialFit::setSample
                        (in_R9,x_00,(double *)CONCAT44(iVar5,in_stack_ffffffffffffffc0),
                         (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0),
                         in_stack_ffffffffffffffb0);
      if (x_00 != (double *)0x0) {
        operator_delete__(x_00);
      }
      return (bool)(bVar2 & 1);
    }
    if (*(double *)(in_RSI + (long)iVar5 * 8) <= 0.0) break;
    dVar4 = log(*(double *)(in_RSI + (long)iVar5 * 8));
    x_00[iVar5] = dVar4;
    iVar5 = iVar5 + 1;
  }
  if (x_00 != (double *)0x0) {
    operator_delete__(x_00);
  }
  return false;
}

Assistant:

bool Logarithm::setSample(double *x, double *y, int count, bool enableWeight, double *w)
{
    //��ȡһ������
    copy(x,y,count);

    //����
    double *px = new double[count];
    for(int i(0) ; i<count ; i++){
        if(x[i] <= 0.0){
            delete [] px;
            return false;
        }

        px[i] = log(x[i]);
    }

    bool ret = PolynomialFit::setSample(px,y,count,enableWeight,w);
    delete [] px;
    return ret;
}